

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O1

MultisamplePixelBufferAccess * __thiscall
sglr::ReferenceContext::getReadColorbuffer
          (MultisamplePixelBufferAccess *__return_storage_ptr__,ReferenceContext *this)

{
  PixelBufferAccess PStack_38;
  
  if (this->m_readFramebufferBinding == (Framebuffer *)0x0) {
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_format =
         (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_format;
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data[2] =
         (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
    *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data =
         *(undefined8 *)
          (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_size.m_data;
    *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data =
         *(undefined8 *)
          (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_pitch.m_data;
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[2] =
         (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_data =
         (this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_data;
  }
  else {
    getFboAttachment(&PStack_38,this,this->m_readFramebufferBinding,ATTACHMENTPOINT_COLOR0);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(__return_storage_ptr__,&PStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

rr::MultisamplePixelBufferAccess	getReadColorbuffer		(void)	{ return (m_readFramebufferBinding) ? (rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(getFboAttachment(*m_readFramebufferBinding, rc::Framebuffer::ATTACHMENTPOINT_COLOR0)))	:	(m_defaultColorbuffer);		}